

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

char * color_type_str(spng_color_type color_type)

{
  char *pcStack_10;
  spng_color_type color_type_local;
  
  switch(color_type) {
  case SPNG_COLOR_TYPE_GRAYSCALE:
    pcStack_10 = "grayscale";
    break;
  default:
    pcStack_10 = "(invalid)";
    break;
  case SPNG_COLOR_TYPE_TRUECOLOR:
    pcStack_10 = "truecolor";
    break;
  case SPNG_COLOR_TYPE_INDEXED:
    pcStack_10 = "indexed color";
    break;
  case SPNG_COLOR_TYPE_GRAYSCALE_ALPHA:
    pcStack_10 = "grayscale with alpha";
    break;
  case SPNG_COLOR_TYPE_TRUECOLOR_ALPHA:
    pcStack_10 = "truecolor with alpha";
  }
  return pcStack_10;
}

Assistant:

const char *color_type_str(enum spng_color_type color_type)
{
    switch(color_type)
    {
        case SPNG_COLOR_TYPE_GRAYSCALE: return "grayscale";
        case SPNG_COLOR_TYPE_TRUECOLOR: return "truecolor";
        case SPNG_COLOR_TYPE_INDEXED: return "indexed color";
        case SPNG_COLOR_TYPE_GRAYSCALE_ALPHA: return "grayscale with alpha";
        case SPNG_COLOR_TYPE_TRUECOLOR_ALPHA: return "truecolor with alpha";
        default: return "(invalid)";
    }
}